

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acec2Mult.c
# Opt level: O2

int Sdb_StoDiffExactlyOne3(Vec_Wec_t *vCuts,int Limit,int *pCut,int *pCount)

{
  uint uVar1;
  int Entry;
  int iVar2;
  int iVar3;
  Vec_Int_t *p;
  int iVar4;
  int i;
  ulong uVar5;
  int iVar6;
  long lVar7;
  int local_58;
  int local_54;
  
  i = 0;
  local_58 = -1;
  local_54 = 0;
  do {
    if ((vCuts->nSize <= i) || (p = Vec_WecEntry(vCuts,i), i == Limit)) {
      *pCount = local_54;
      return local_58;
    }
    uVar1 = *pCut;
    uVar5 = 0;
    if (0 < (int)uVar1) {
      uVar5 = (ulong)uVar1;
    }
    iVar2 = (int)uVar5 + 1;
    iVar6 = -1;
    for (lVar7 = 1; lVar7 - uVar5 != 1; lVar7 = lVar7 + 1) {
      Entry = pCut[lVar7];
      iVar3 = Vec_IntFind(p,Entry);
      iVar4 = iVar6;
      if ((iVar3 < 0) && (iVar4 = Entry, iVar6 != -1)) {
        iVar2 = (int)lVar7;
        break;
      }
      iVar6 = iVar4;
    }
    if ((iVar2 == uVar1 + 1) && (iVar6 != -1)) {
      if (local_58 == -1) {
        local_58 = iVar6;
      }
      local_54 = local_54 + (uint)(local_58 == iVar6);
    }
    i = i + 1;
  } while( true );
}

Assistant:

int Sdb_StoDiffExactlyOne3( Vec_Wec_t * vCuts, int Limit, int * pCut, int * pCount )
{
    Vec_Int_t * vCut;  
    int i, iNewAll = -1, Count = 0;
    Vec_WecForEachLevel( vCuts, vCut, i )
    {
        int k, iNew = -1;
        if ( i == Limit )
            break;
        for ( k = 1; k <= pCut[0]; k++ )
        {
            if ( Vec_IntFind(vCut, pCut[k]) >= 0 )
                continue;
            if ( iNew == -1 )
                iNew = pCut[k];
            else 
                break;
        }
        if ( k == pCut[0] + 1 && iNew != -1 )
        {
            if ( iNewAll == -1 )
                iNewAll = iNew;
            if ( iNewAll == iNew )
                Count++;
        }
    }
    *pCount = Count;
    return iNewAll;
}